

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

int al_get_monitor_dpi(int adapter)

{
  _func_int *p_Var1;
  _func_int_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  ALLEGRO_SYSTEM *pAVar3;
  ALLEGRO_SYSTEM *pAVar4;
  
  pAVar3 = al_get_system_driver();
  pAVar4 = al_get_system_driver();
  iVar2 = 0;
  if (((pAVar4 != (ALLEGRO_SYSTEM *)0x0) && (pAVar4->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (p_Var1 = pAVar4->vt->get_num_video_adapters, p_Var1 != (_func_int *)0x0)) {
    iVar2 = (*p_Var1)();
  }
  if (((pAVar3 != (ALLEGRO_SYSTEM *)0x0 && adapter < iVar2) &&
      (pAVar3->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = pAVar3->vt->get_monitor_dpi,
     UNRECOVERED_JUMPTABLE != (_func_int_int *)0x0)) {
    iVar2 = (*UNRECOVERED_JUMPTABLE)(adapter);
    return iVar2;
  }
  return 0;
}

Assistant:

int al_get_monitor_dpi(int adapter)
{
   ALLEGRO_SYSTEM *system = al_get_system_driver();

   if (adapter < al_get_num_video_adapters()) {
       if (system && system->vt && system->vt->get_monitor_dpi) {
           return system->vt->get_monitor_dpi(adapter);
       }
   }

   return 0;
}